

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::custom_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          function<void_(unsigned_int_&,_unsigned_int)> *per_pixel_fn)

{
  function<void_(unsigned_int_&,_unsigned_int)> *this_00;
  uint32_t local_48;
  uint local_44;
  uint32_t dc;
  uint32_t sc;
  int xx;
  int yy;
  ssize_t h_local;
  ssize_t w_local;
  ssize_t y_local;
  ssize_t x_local;
  Image *source_local;
  Image *this_local;
  
  this_00 = per_pixel_fn;
  _xx = h;
  h_local = w;
  w_local = y;
  y_local = x;
  x_local = (ssize_t)source;
  source_local = this;
  if (w < 0) {
    h_local = get_width(source);
  }
  if ((long)_xx < 0) {
    _xx = get_height((Image *)x_local);
  }
  clamp_blit_dimensions(this,(Image *)x_local,&y_local,&w_local,&h_local,(ssize_t *)&xx,&sx,&sy);
  for (sc = 0; (long)(int)sc < (long)_xx; sc = sc + 1) {
    for (dc = 0; (int)dc < h_local; dc = dc + 1) {
      local_44 = read_pixel((Image *)x_local,sx + (int)dc,sy + (int)sc);
      local_48 = read_pixel(this,y_local + (int)dc,w_local + (int)sc);
      ::std::function<void_(unsigned_int_&,_unsigned_int)>::operator()(this_00,&local_48,local_44);
      write_pixel(this,y_local + (int)dc,w_local + (int)sc,local_48);
    }
  }
  return;
}

Assistant:

void Image::custom_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy,
    function<void(uint32_t&, uint32_t)> per_pixel_fn) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint32_t sc = source.read_pixel(sx + xx, sy + yy);
      uint32_t dc = this->read_pixel(x + xx, y + yy);
      per_pixel_fn(dc, sc);
      this->write_pixel(x + xx, y + yy, dc);
    }
  }
}